

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_publisher_link.cpp
# Opt level: O0

void __thiscall
miniros::TransportPublisherLink::onMessageLength
          (TransportPublisherLink *this,ConnectionPtr *conn,shared_ptr<unsigned_char[]> *buffer,
          uint32_t size,bool success)

{
  bool bVar1;
  element_type *this_00;
  element_type *__nbytes;
  uint *puVar2;
  element_type *peVar3;
  size_t __nbytes_00;
  __shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  long *in_RDI;
  byte in_R8B;
  bool enabled;
  uint32_t len;
  undefined8 in_stack_fffffffffffffee8;
  Level level;
  LogLocation *in_stack_fffffffffffffef0;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  uint __fd;
  Level in_stack_ffffffffffffff14;
  string *name;
  LogLocation *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  undefined1 *__buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined1 local_b8 [38];
  undefined1 local_92;
  undefined1 local_91 [37];
  uint local_6c;
  undefined1 local_60 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  level = (Level)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_30.field_2._M_local_buf[3] = in_R8B & 1;
  local_30.field_2._8_8_ = in_RDX;
  if ((int)in_RDI[0x24] != -1) {
    in_stack_ffffffffffffff30 = &local_30;
    getInternalTimerManager();
    this_00 = std::
              __shared_ptr_access<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x511454);
    TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::remove
              (this_00,(char *)(ulong)*(uint *)(in_RDI + 0x24));
    std::
    shared_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>_>
    ::~shared_ptr((shared_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>_>
                   *)0x511476);
    *(undefined4 *)(in_RDI + 0x24) = 0xffffffff;
  }
  if ((local_30.field_2._M_local_buf[3] & 1U) == 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x21));
    if (bVar1) {
      __nbytes = std::
                 __shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x5114e6);
      __buf = local_60;
      peVar3 = __nbytes;
      std::
      function<void(std::shared_ptr<miniros::Connection>const&,std::shared_ptr<unsigned_char[]>const&,unsigned_int,bool)>
      ::
      function<miniros::TransportPublisherLink::onMessageLength(std::shared_ptr<miniros::Connection>const&,std::shared_ptr<unsigned_char[]>const&,unsigned_int,bool)::__0,void>
                ((function<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool)>
                  *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8);
      Connection::read(peVar3,4,__buf,(size_t)__nbytes);
      std::
      function<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool)>
      ::~function((function<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool)>
                   *)0x511538);
    }
  }
  else {
    puVar2 = (uint *)std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::get
                               ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)
                                local_30.field_2._8_8_);
    local_6c = *puVar2;
    if (local_6c < 0x3b9aca01) {
      peVar3 = std::
               __shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x511711);
      __nbytes_00 = (size_t)local_6c;
      __fd = local_6c;
      std::
      function<void(std::shared_ptr<miniros::Connection>const&,std::shared_ptr<unsigned_char[]>const&,unsigned_int,bool)>
      ::
      function<miniros::TransportPublisherLink::onMessageLength(std::shared_ptr<miniros::Connection>const&,std::shared_ptr<unsigned_char[]>const&,unsigned_int,bool)::__1,void>
                ((function<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool)>
                  *)CONCAT44(local_6c,in_stack_ffffffffffffff00),(anon_class_8_1_8991fb9c *)peVar3);
      Connection::read(peVar3,__fd,local_b8,__nbytes_00);
      std::
      function<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool)>
      ::~function((function<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool)>
                   *)0x511761);
    }
    else {
      if (((CONCAT71(0x6410,console::g_initialized) ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((onMessageLength::loc.initialized_ ^ 0xffU) & 1) != 0) {
        name = (string *)local_91;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   (allocator<char> *)in_stack_ffffffffffffff20);
        console::initializeLogLocation(in_stack_ffffffffffffff20,name,in_stack_ffffffffffffff14);
        std::__cxx11::string::~string((string *)(local_91 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_91);
      }
      if (onMessageLength::loc.level_ != Error) {
        console::setLogLocationLevel(in_stack_fffffffffffffef0,level);
        console::checkLogLocationEnabled
                  ((LogLocation *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      }
      local_92 = (onMessageLength::loc.logger_enabled_ & 1U) != 0;
      if ((bool)local_92) {
        console::print((FilterBase *)0x0,onMessageLength::loc.logger_,
                       (Level)(ulong)onMessageLength::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport_publisher_link.cpp"
                       ,0xd5,
                       "void miniros::TransportPublisherLink::onMessageLength(const ConnectionPtr &, const std::shared_ptr<uint8_t[]> &, uint32_t, bool)"
                       ,
                       "a message of over a gigabyte was predicted in tcpros. that seems highly unlikely, so I\'ll assume protocol synchronization is lost."
                      );
      }
      (**(code **)(*in_RDI + 0x28))();
    }
  }
  return;
}

Assistant:

void TransportPublisherLink::onMessageLength(const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
{
  (void)conn;
  (void)size;
  if (retry_timer_handle_ != -1)
  {
    getInternalTimerManager()->remove(retry_timer_handle_);
    retry_timer_handle_ = -1;
  }

  if (!success)
  {
    if (connection_) {
      connection_->read(4,
        [this](const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
        {
          this->onMessageLength(conn, buffer, size, success);
        });
    }
    return;
  }

  MINIROS_ASSERT(conn == connection_);
  MINIROS_ASSERT(size == 4);

  uint32_t len = *((uint32_t*)buffer.get());

  if (len > 1000000000)
  {
    MINIROS_ERROR("a message of over a gigabyte was " \
                "predicted in tcpros. that seems highly " \
                "unlikely, so I'll assume protocol " \
                "synchronization is lost.");
    drop();
    return;
  }

  connection_->read(len,
    [this](const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
    {
      this->onMessage(conn, buffer, size, success);
    });
}